

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sSpecialFloatTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Stress::anon_unknown_0::VertexAttributeCase::deinit(VertexAttributeCase *this)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  Functions *gl;
  VertexAttributeCase *this_local;
  long lVar3;
  
  pRVar2 = Context::getRenderContext((this->super_RenderCase).super_TestCase.m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  RenderCase::deinit(&this->super_RenderCase);
  if (this->m_attribVboID != 0) {
    (**(code **)(lVar3 + 0x438))(1,&this->m_attribVboID);
    this->m_attribVboID = 0;
  }
  if (this->m_positionVboID != 0) {
    (**(code **)(lVar3 + 0x438))(1,&this->m_positionVboID);
    this->m_positionVboID = 0;
  }
  if (this->m_elementVboID != 0) {
    (**(code **)(lVar3 + 0x438))(1,&this->m_elementVboID);
    this->m_elementVboID = 0;
  }
  return;
}

Assistant:

void VertexAttributeCase::deinit (void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	RenderCase::deinit();

	if (m_attribVboID)
	{
		gl.deleteBuffers(1, &m_attribVboID);
		m_attribVboID = 0;
	}

	if (m_positionVboID)
	{
		gl.deleteBuffers(1, &m_positionVboID);
		m_positionVboID = 0;
	}

	if (m_elementVboID)
	{
		gl.deleteBuffers(1, &m_elementVboID);
		m_elementVboID = 0;
	}
}